

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Qualifier.h
# Opt level: O0

void __thiscall Refal2::CQualifier::CQualifier(CQualifier *this)

{
  CQualifier *this_local;
  
  std::bitset<128UL>::bitset(&this->ansichars);
  CFastSet<char>::CFastSet(&this->chars);
  CFastSet<int>::CFastSet(&this->labels);
  CFastSet<unsigned_int>::CFastSet(&this->numbers);
  Empty(this);
  return;
}

Assistant:

CQualifier() { Empty(); }